

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.h
# Opt level: O2

uint32_t SuperFastHash(char *data,uint32_t len,uint32_t hash)

{
  size_t sVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  
  sVar1 = (size_t)len;
  if (data == (char *)0x0) {
    return 0;
  }
  if (len == 0) {
    sVar1 = strlen(data);
  }
  uVar2 = (ulong)((uint)sVar1 & 0xfffffffc);
  for (lVar3 = 0; ((uint)(sVar1 >> 2) & 0x3fffffff) != (uint)lVar3; lVar3 = lVar3 + 1) {
    uVar4 = (hash + *(ushort *)(data + lVar3 * 4)) * 0x10000 ^
            (uint)*(ushort *)(data + lVar3 * 4 + 2) << 0xb ^ hash + *(ushort *)(data + lVar3 * 4);
    hash = uVar4 + (uVar4 >> 0xb);
  }
  switch((uint)sVar1 & 3) {
  case 0:
    goto switchD_0012d608_caseD_0;
  case 1:
    uVar4 = (hash + (int)data[uVar2]) * 0x400 ^ hash + (int)data[uVar2];
    uVar5 = uVar4 >> 1;
    break;
  case 2:
    uVar4 = (hash + *(ushort *)(data + uVar2)) * 0x800 ^ hash + *(ushort *)(data + uVar2);
    uVar5 = uVar4 >> 0x11;
    break;
  case 3:
    uVar4 = (hash + *(ushort *)(data + uVar2)) * 0x10000 ^
            (int)data[uVar2 + 2] << 0x12 ^ hash + *(ushort *)(data + uVar2);
    hash = (uVar4 >> 0xb) + uVar4;
    goto switchD_0012d608_caseD_0;
  }
  hash = uVar5 + uVar4;
switchD_0012d608_caseD_0:
  uVar4 = hash * 8 ^ hash;
  uVar4 = (uVar4 >> 5) + uVar4;
  uVar4 = uVar4 * 0x10 ^ uVar4;
  uVar4 = (uVar4 >> 0x11) + uVar4;
  uVar4 = uVar4 * 0x2000000 ^ uVar4;
  return (uVar4 >> 6) + uVar4;
}

Assistant:

inline uint32_t SuperFastHash (const char * data, uint32_t len = 0, uint32_t hash = 0) {
uint32_t tmp;
int rem;

    if (!data) return 0;
    if (!len)len = (uint32_t)::strlen(data);

    rem = len & 3;
    len >>= 2;

    /* Main loop */
    for (;len > 0; len--) {
        hash  += get16bits (data);
        tmp    = (get16bits (data+2) << 11) ^ hash;
        hash   = (hash << 16) ^ tmp;
        data  += 2*sizeof (uint16_t);
        hash  += hash >> 11;
    }

    /* Handle end cases */
    switch (rem) {
        case 3: hash += get16bits (data);
                hash ^= hash << 16;
                hash ^= data[sizeof (uint16_t)] << 18;
                hash += hash >> 11;
                break;
        case 2: hash += get16bits (data);
                hash ^= hash << 11;
                hash += hash >> 17;
                break;
        case 1: hash += *data;
                hash ^= hash << 10;
                hash += hash >> 1;
    }

    /* Force "avalanching" of final 127 bits */
    hash ^= hash << 3;
    hash += hash >> 5;
    hash ^= hash << 4;
    hash += hash >> 17;
    hash ^= hash << 25;
    hash += hash >> 6;

    return hash;
}